

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_distinct.cpp
# Opt level: O2

PhysicalOperator * __thiscall
duckdb::PhysicalPlanGenerator::CreatePlan(PhysicalPlanGenerator *this,LogicalDistinct *op)

{
  _Head_base<0UL,_duckdb::BoundOrderModifier_*,_false> _Var1;
  ClientContext *context;
  undefined1 auVar2 [8];
  undefined1 auVar3 [8];
  PhysicalPlanGenerator *this_00;
  reference this_01;
  type op_00;
  vector<duckdb::LogicalType,_true> *args;
  pointer puVar4;
  reference this_02;
  pointer pEVar5;
  BoundReferenceExpression *pBVar6;
  mapped_type *pmVar7;
  const_reference other;
  iterator iVar8;
  pointer pBVar9;
  ClientConfig *pCVar10;
  type aggr;
  PhysicalOperator *pPVar11;
  PhysicalOperator *pPVar12;
  InternalException *this_03;
  pointer puVar13;
  pointer pLVar14;
  long lVar15;
  pointer pLVar16;
  idx_t i;
  ulong __n;
  bool bVar17;
  undefined1 local_2e0 [8];
  Binder *local_2d8;
  undefined1 local_2d0 [8];
  bool changes_made;
  PhysicalPlanGenerator *local_2c0;
  long *local_2b8;
  FunctionBinder function_binder;
  size_type local_2a0;
  unsigned_long group_index;
  undefined8 uStack_290;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288 [2];
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  aggregates;
  reference<PhysicalOperator> child;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  projections;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  groups;
  aggregate_update_t local_1f0;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  local_1e8;
  vector<duckdb::LogicalType,_true> aggregate_types;
  unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  group_by_references;
  value_type logical_type;
  AggregateFunction local_160;
  
  this_01 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
            ::get<true>(&(op->super_LogicalOperator).children,0);
  op_00 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
          operator*(this_01);
  local_2c0 = this;
  local_288[1]._8_8_ = CreatePlan(this,op_00);
  args = &((PhysicalOperator *)local_288[1]._8_8_)->types;
  groups.
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  groups.
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  groups.
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  aggregates.
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  aggregates.
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  aggregates.
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  projections.
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  projections.
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  projections.
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar13 = (op->distinct_targets).
            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar4 = (op->distinct_targets).
           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar15 = (long)puVar4 - (long)puVar13 >> 3;
  group_by_references._M_h._M_buckets = &group_by_references._M_h._M_single_bucket;
  group_by_references._M_h._M_bucket_count = 1;
  group_by_references._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  group_by_references._M_h._M_element_count = 0;
  group_by_references._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  group_by_references._M_h._M_rehash_policy._M_next_resize = 0;
  group_by_references._M_h._M_single_bucket = (__node_base_ptr)0x0;
  aggregate_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  aggregate_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  aggregate_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  child._M_data = (PhysicalOperator *)local_288[1]._8_8_;
  for (__n = 0; __n < (ulong)((long)puVar4 - (long)puVar13 >> 3); __n = __n + 1) {
    this_02 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
              ::get<true>(&op->distinct_targets,__n);
    pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(this_02);
    if ((pEVar5->super_BaseExpression).type == BOUND_REF) {
      pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(this_02);
      pBVar6 = BaseExpression::Cast<duckdb::BoundReferenceExpression>(&pEVar5->super_BaseExpression)
      ;
      pmVar7 = ::std::__detail::
               _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&group_by_references,&pBVar6->index);
      *pmVar7 = __n;
    }
    pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(this_02);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
              (&aggregate_types.
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
               &pEVar5->return_type);
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                *)&groups,this_02);
    puVar13 = (op->distinct_targets).
              super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar4 = (op->distinct_targets).
             super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  pLVar16 = (((vector<duckdb::LogicalType,_true> *)(local_288[1]._8_8_ + 0x28))->
            super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
            super__Vector_impl_data._M_start;
  pLVar14 = *(pointer *)(local_288[1]._8_8_ + 0x30);
  bVar17 = ((long)pLVar14 - (long)pLVar16) / 0x18 != lVar15;
  local_2a0 = 0;
  do {
    this_00 = local_2c0;
    if ((ulong)(((long)pLVar14 - (long)pLVar16) / 0x18) <= local_2a0) {
      child._M_data =
           ExtractAggregateExpressions
                     (local_2c0,(PhysicalOperator *)local_288[1]._8_8_,&aggregates,&groups);
      pPVar11 = Make<duckdb::PhysicalHashAggregate,duckdb::ClientContext&,duckdb::vector<duckdb::LogicalType,true>&,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,unsigned_long&>
                          (this_00,this_00->context,&aggregate_types,&aggregates,&groups,
                           &(child._M_data)->estimated_cardinality);
      ::std::
      vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
      ::push_back(&(pPVar11->children).
                   super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                  ,&child);
      pPVar12 = pPVar11;
      if (bVar17) {
        pPVar12 = Make<duckdb::PhysicalProjection,duckdb::vector<duckdb::LogicalType,true>const&,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,unsigned_long&>
                            (local_2c0,args,&projections,&pPVar11->estimated_cardinality);
        group_index = (unsigned_long)pPVar11;
        ::std::
        vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
        ::emplace_back<std::reference_wrapper<duckdb::PhysicalOperator>>
                  ((vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
                    *)&pPVar12->children,(reference_wrapper<duckdb::PhysicalOperator> *)&group_index
                  );
      }
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                (&aggregate_types.
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
      ::std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&group_by_references._M_h);
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ::~vector(&projections.
                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               );
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ::~vector(&aggregates.
                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               );
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ::~vector(&groups.
                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               );
      return pPVar12;
    }
    other = vector<duckdb::LogicalType,_true>::get<true>(args,local_2a0);
    LogicalType::LogicalType(&logical_type,other);
    iVar8 = ::std::
            _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&group_by_references._M_h,&local_2a0);
    if (iVar8.super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur
        == (__node_type *)0x0) {
      if (((op->super_LogicalOperator).field_0x61 == '\0') &&
         ((op->order_by).
          super_unique_ptr<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::BoundOrderModifier_*,_std::default_delete<duckdb::BoundOrderModifier>_>
          .super__Head_base<0UL,_duckdb::BoundOrderModifier_*,_false>._M_head_impl !=
          (BoundOrderModifier *)0x0)) {
        this_03 = (InternalException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&group_index,
                   "Entry that is not a group, but not a DISTINCT ON aggregate",
                   (allocator *)&function_binder);
        InternalException::InternalException(this_03,(string *)&group_index);
        __cxa_throw(this_03,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      make_uniq<duckdb::BoundReferenceExpression,duckdb::LogicalType&,unsigned_long&>
                ((duckdb *)&local_2d8,&logical_type,&local_2a0);
      function_binder.binder.ptr = local_2d8;
      group_index = 0;
      uStack_290 = 0;
      local_288[0]._M_allocated_capacity = (pointer)0x0;
      local_2d8 = (Binder *)0x0;
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)&group_index,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &function_binder);
      if (function_binder.binder.ptr != (Binder *)0x0) {
        (*(code *)((((function_binder.binder.ptr)->super_enable_shared_from_this<duckdb::Binder>).
                    __weak_this_.internal.
                    super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
      }
      FunctionBinder::FunctionBinder(&function_binder,local_2c0->context);
      FirstFunctionGetter::GetFunction(&local_160,&logical_type);
      local_1e8.
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)group_index;
      local_1e8.
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)uStack_290;
      local_1e8.
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_288[0]._0_8_;
      local_288[0]._M_allocated_capacity = (pointer)0x0;
      group_index = 0;
      uStack_290 = 0;
      local_2b8 = (long *)0x0;
      FunctionBinder::BindAggregateFunction
                ((FunctionBinder *)local_2d0,(AggregateFunction *)&function_binder,
                 (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  *)&local_160,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &local_1e8,(AggregateType)&local_2b8);
      if (local_2b8 != (long *)0x0) {
        (**(code **)(*local_2b8 + 8))();
      }
      local_2b8 = (long *)0x0;
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ::~vector(&local_1e8);
      AggregateFunction::~AggregateFunction(&local_160);
      if ((op->order_by).
          super_unique_ptr<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::BoundOrderModifier_*,_std::default_delete<duckdb::BoundOrderModifier>_>
          .super__Head_base<0UL,_duckdb::BoundOrderModifier_*,_false>._M_head_impl ==
          (BoundOrderModifier *)0x0) {
        local_2e0 = (undefined1  [8])0x0;
      }
      else {
        unique_ptr<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>,_true>
        ::operator->(&op->order_by);
        BoundOrderModifier::Copy((BoundOrderModifier *)local_2e0);
      }
      pBVar9 = unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
               ::operator->((unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
                             *)local_2d0);
      auVar2 = local_2e0;
      local_2e0 = (undefined1  [8])0x0;
      _Var1._M_head_impl =
           (pBVar9->order_bys).
           super_unique_ptr<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>_>
           ._M_t.
           super___uniq_ptr_impl<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::BoundOrderModifier_*,_std::default_delete<duckdb::BoundOrderModifier>_>
           .super__Head_base<0UL,_duckdb::BoundOrderModifier_*,_false>._M_head_impl;
      (pBVar9->order_bys).
      super_unique_ptr<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::BoundOrderModifier_*,_std::default_delete<duckdb::BoundOrderModifier>_>
      .super__Head_base<0UL,_duckdb::BoundOrderModifier_*,_false>._M_head_impl =
           (BoundOrderModifier *)auVar2;
      if (_Var1._M_head_impl != (BoundOrderModifier *)0x0) {
        (**(code **)(*(long *)&(_Var1._M_head_impl)->super_BoundResultModifier + 8))();
        if (local_2e0 != (undefined1  [8])0x0) {
          (*((BoundResultModifier *)local_2e0)->_vptr_BoundResultModifier[1])();
        }
      }
      pCVar10 = ClientConfig::GetConfig(local_2c0->context);
      if (pCVar10->enable_optimizer == true) {
        _changes_made = (ClientContext *)((ulong)_changes_made & 0xffffffffffffff00);
        context = local_2c0->context;
        aggr = unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
               ::operator*((unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
                            *)local_2d0);
        OrderedAggregateOptimizer::Apply
                  ((OrderedAggregateOptimizer *)local_2e0,context,aggr,&groups,&changes_made);
        auVar3 = local_2d0;
        auVar2 = local_2e0;
        if (local_2e0 != (undefined1  [8])0x0) {
          local_2e0 = (undefined1  [8])0x0;
          local_2d0 = auVar2;
          if (auVar3 != (undefined1  [8])0x0) {
            (*((BoundResultModifier *)auVar3)->_vptr_BoundResultModifier[1])();
            if (local_2e0 != (undefined1  [8])0x0) {
              (*((BoundResultModifier *)local_2e0)->_vptr_BoundResultModifier[1])();
            }
          }
        }
      }
      local_1f0 = (aggregate_update_t)
                  (((long)aggregates.
                          super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                          .
                          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)aggregates.
                          super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                          .
                          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) + lVar15);
      make_uniq<duckdb::BoundReferenceExpression,duckdb::LogicalType&,unsigned_long>
                ((duckdb *)&changes_made,&logical_type,(unsigned_long *)&local_1f0);
      local_2e0 = (undefined1  [8])_changes_made;
      _changes_made = (ClientContext *)0x0;
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)&projections,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 local_2e0);
      if (local_2e0 != (undefined1  [8])0x0) {
        (*(code *)(((((enable_shared_from_this<duckdb::ClientContext> *)local_2e0)->__weak_this_).
                    internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.
                  internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)();
      }
      local_2e0 = (undefined1  [8])0x0;
      if (_changes_made != (ClientContext *)0x0) {
        (*(code *)(((_changes_made->super_enable_shared_from_this<duckdb::ClientContext>).
                    __weak_this_.internal.
                    super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
                  super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi)();
      }
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                (&aggregate_types.
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
                 &logical_type);
      local_2e0 = local_2d0;
      local_2d0 = (undefined1  [8])0x0;
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)&aggregates,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 local_2e0);
      if (local_2e0 != (undefined1  [8])0x0) {
        (*((BoundResultModifier *)local_2e0)->_vptr_BoundResultModifier[1])();
      }
      if (local_2d0 != (undefined1  [8])0x0) {
        (*((BoundResultModifier *)local_2d0)->_vptr_BoundResultModifier[1])();
      }
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 *)&group_index);
      if (local_2d8 != (Binder *)0x0) {
        (*(code *)(((local_2d8->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal
                    .super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
      }
      bVar17 = true;
    }
    else {
      group_index = *(unsigned_long *)
                     ((long)iVar8.
                            super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>
                            ._M_cur + 0x10);
      make_uniq<duckdb::BoundReferenceExpression,duckdb::LogicalType&,unsigned_long&>
                ((duckdb *)&local_2d8,&logical_type,&group_index);
      function_binder.binder.ptr = local_2d8;
      local_2d8 = (Binder *)0x0;
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)&projections,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &function_binder);
      if (function_binder.binder.ptr != (Binder *)0x0) {
        (*(code *)((((function_binder.binder.ptr)->super_enable_shared_from_this<duckdb::Binder>).
                    __weak_this_.internal.
                    super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
      }
      function_binder.binder.ptr = (Binder *)0x0;
      if (local_2d8 != (Binder *)0x0) {
        (*(code *)(((local_2d8->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal
                    .super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
      }
      bVar17 = (bool)(group_index != local_2a0 | bVar17);
    }
    LogicalType::~LogicalType(&logical_type);
    local_2a0 = local_2a0 + 1;
    pLVar16 = (((vector<duckdb::LogicalType,_true> *)(local_288[1]._8_8_ + 0x28))->
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_start;
    pLVar14 = *(pointer *)(local_288[1]._8_8_ + 0x30);
  } while( true );
}

Assistant:

PhysicalOperator &PhysicalPlanGenerator::CreatePlan(LogicalDistinct &op) {
	D_ASSERT(op.children.size() == 1);
	reference<PhysicalOperator> child = CreatePlan(*op.children[0]);
	auto &distinct_targets = op.distinct_targets;
	D_ASSERT(!distinct_targets.empty());

	auto &types = child.get().GetTypes();
	vector<unique_ptr<Expression>> groups, aggregates, projections;
	idx_t group_count = distinct_targets.size();
	unordered_map<idx_t, idx_t> group_by_references;
	vector<LogicalType> aggregate_types;
	// creates one group per distinct_target
	for (idx_t i = 0; i < distinct_targets.size(); i++) {
		auto &target = distinct_targets[i];
		if (target->GetExpressionType() == ExpressionType::BOUND_REF) {
			auto &bound_ref = target->Cast<BoundReferenceExpression>();
			group_by_references[bound_ref.index] = i;
		}
		aggregate_types.push_back(target->return_type);
		groups.push_back(std::move(target));
	}
	bool requires_projection = false;
	if (types.size() != group_count) {
		requires_projection = true;
	}
	// we need to create one aggregate per column in the select_list
	for (idx_t i = 0; i < types.size(); ++i) {
		auto logical_type = types[i];
		// check if we can directly refer to a group, or if we need to push an aggregate with FIRST
		auto entry = group_by_references.find(i);
		if (entry != group_by_references.end()) {
			auto group_index = entry->second;
			// entry is found: can directly refer to a group
			projections.push_back(make_uniq<BoundReferenceExpression>(logical_type, group_index));
			if (group_index != i) {
				// we require a projection only if this group element is out of order
				requires_projection = true;
			}
		} else {
			if (op.distinct_type == DistinctType::DISTINCT && op.order_by) {
				throw InternalException("Entry that is not a group, but not a DISTINCT ON aggregate");
			}
			// entry is not one of the groups: need to push a FIRST aggregate
			auto bound = make_uniq<BoundReferenceExpression>(logical_type, i);
			vector<unique_ptr<Expression>> first_children;
			first_children.push_back(std::move(bound));

			FunctionBinder function_binder(context);
			auto first_aggregate =
			    function_binder.BindAggregateFunction(FirstFunctionGetter::GetFunction(logical_type),
			                                          std::move(first_children), nullptr, AggregateType::NON_DISTINCT);
			first_aggregate->order_bys = op.order_by ? op.order_by->Copy() : nullptr;

			if (ClientConfig::GetConfig(context).enable_optimizer) {
				bool changes_made = false;
				auto new_expr = OrderedAggregateOptimizer::Apply(context, *first_aggregate, groups, changes_made);
				if (new_expr) {
					D_ASSERT(new_expr->return_type == first_aggregate->return_type);
					D_ASSERT(new_expr->GetExpressionType() == ExpressionType::BOUND_AGGREGATE);
					first_aggregate = unique_ptr_cast<Expression, BoundAggregateExpression>(std::move(new_expr));
				}
			}
			// add the projection
			projections.push_back(make_uniq<BoundReferenceExpression>(logical_type, group_count + aggregates.size()));
			// push it to the list of aggregates
			aggregate_types.push_back(logical_type);
			aggregates.push_back(std::move(first_aggregate));
			requires_projection = true;
		}
	}

	child = ExtractAggregateExpressions(child, aggregates, groups);

	// we add a physical hash aggregation in the plan to select the distinct groups
	auto &group_by = Make<PhysicalHashAggregate>(context, aggregate_types, std::move(aggregates), std::move(groups),
	                                             child.get().estimated_cardinality);
	group_by.children.push_back(child);
	if (!requires_projection) {
		return group_by;
	}

	// we add a physical projection on top of the aggregation to project all members in the select list
	auto &proj = Make<PhysicalProjection>(types, std::move(projections), group_by.estimated_cardinality);
	proj.children.push_back(group_by);
	return proj;
}